

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

AuxNode * kj::_::
          CopyConstructArray_<capnp::compiler::NodeTranslator::AuxNode,_capnp::compiler::NodeTranslator::AuxNode_*,_true,_false>
          ::apply(AuxNode *pos,AuxNode *start,AuxNode *end)

{
  ExceptionGuard local_28;
  
  for (; start != end; start = start + 1) {
    capnp::compiler::NodeTranslator::AuxNode::AuxNode(pos,start);
    pos = pos + 1;
  }
  local_28.start = pos;
  local_28.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }